

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void InitClass(nodecontext *p,nodeclass *Class)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  node *pnVar4;
  size_t local_58;
  nodemetalookuphead *local_40;
  nodeclass **nc;
  nodemeta *pnStack_30;
  fourcc_t ClassId;
  nodemeta *i;
  uintptr_t Data;
  nodeclass *Parent;
  nodeclass *Class_local;
  nodecontext *p_local;
  
  Data = (uintptr_t)Class->ParentClass;
  if (((Class->State == '\0') && (Class->Meta != (nodemeta *)0x0)) &&
     ((Class->ParentId == 0 ||
      (((nodeclass *)Data != (nodeclass *)0x0 && ('\0' < ((nodeclass *)Data)->State)))))) {
    Parent = Class;
    Class_local = (nodeclass *)p;
    if ((nodeclass *)Data != (nodeclass *)0x0) {
      if (((Class->VMTSize == 0x48) && (0x48 < ((nodeclass *)Data)->VMTSize)) &&
         (Parent = NodeClassResize(p,Class,((nodeclass *)Data)->VMTSize), Parent == (nodeclass *)0x0
         )) {
        return;
      }
      if (*(ulong *)(Data + 0x40) < 0x48) {
        __assert_fail("Parent->VMTSize >= DEFAULT_VMT",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x485,"void InitClass(nodecontext *, nodeclass *)");
      }
      if (Parent->VMTSize < *(ulong *)(Data + 0x40)) {
        __assert_fail("Class->VMTSize >= Parent->VMTSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x486,"void InitClass(nodecontext *, nodeclass *)");
      }
      if (*(long *)(Data + 0x48) != *(long *)(Parent + 1)) {
        __assert_fail("NodeClass_Context(Parent) == NodeClass_Context(Class)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x487,"void InitClass(nodecontext *, nodeclass *)");
      }
      uVar1 = *(undefined4 *)&Parent[1].Meta;
      if (*(ulong *)(Data + 0x40) < Parent->VMTSize) {
        local_58 = *(size_t *)(Data + 0x40);
      }
      else {
        local_58 = Parent->VMTSize;
      }
      memcpy(Parent + 1,(void *)(Data + 0x48),local_58);
      *(undefined4 *)&Parent[1].Meta = uVar1;
    }
    BuildMetaLookup((nodecontext *)Class_local,Parent);
    if (Parent->VMTSize < 0x48) {
      __assert_fail("Class->VMTSize >= DEFAULT_VMT",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x490,"void InitClass(nodecontext *, nodeclass *)");
    }
    Parent->State = '\x01';
    for (pnStack_30 = Parent->Meta;
        ((undefined1  [16])*pnStack_30 & (undefined1  [16])0xff) != (undefined1  [16])0x0;
        pnStack_30 = pnStack_30 + 1) {
      if (((undefined1  [16])*pnStack_30 & (undefined1  [16])0xc0) == (undefined1  [16])0xc0) {
        MetaConst(pnStack_30,Parent + 1);
      }
      else {
        switch(*(undefined1 *)pnStack_30) {
        case 0xb:
          Parent->Flags = (uint8_t)pnStack_30->Data;
          break;
        case 0xc:
          Parent->Priority = (short)pnStack_30->Data + -1000;
          break;
        case 0x10:
          iVar2 = (*(code *)pnStack_30->Data)(*(undefined4 *)&Parent[1].Meta,Parent + 1);
          if (iVar2 != 0) {
            ReleaseMetaLookup((nodecontext *)Class_local,Parent);
            Class_local[1].Module = (nodemodule *)0x0;
            Parent->State = -2;
          }
          break;
        case 0x12:
          lVar3 = (*(code *)pnStack_30->Data)(Class_local,Parent + 1,0xb,&i);
          if (lVar3 != 0) {
            Parent->Flags = (uint8_t)i;
          }
          lVar3 = (*(code *)pnStack_30->Data)(Class_local,Parent + 1,0xc,&i);
          if (lVar3 != 0) {
            Parent->Priority = (short)i + -1000;
          }
        }
      }
    }
    if ((('\0' < Parent->State) && ((Parent->Flags & 0x21) == 1)) &&
       (pnVar4 = NodeCreateFromClass((nodecontext *)Class_local,Parent,1), pnVar4 == (node *)0x0)) {
      Class_local[1].Module = (nodemodule *)0x0;
      Parent->State = -2;
      UnInitClass((nodecontext *)Class_local,Parent,0);
    }
    if ('\0' < Parent->State) {
      if (Class_local == (nodeclass *)0xffffffffffffff90) {
        __assert_fail("&(p->NodeClass)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x4c3,"void InitClass(nodecontext *, nodeclass *)");
      }
      local_40 = Class_local[1].MetaSet;
      while( true ) {
        if (Class_local == (nodeclass *)0xffffffffffffff90) {
          __assert_fail("&(p->NodeClass)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x4c3,"void InitClass(nodecontext *, nodeclass *)");
        }
        if (local_40 ==
            (nodemetalookuphead *)
            ((long)&(Class_local[1].MetaSet)->Upper +
            ((ulong)Class_local[1].MetaUnSet & 0xfffffffffffffff8))) break;
        if (*(nodeclass **)(local_40->Upper + 0x18) == Parent) {
          InitClass((nodecontext *)Class_local,(nodeclass *)local_40->Upper);
        }
        local_40 = local_40 + 1;
      }
    }
  }
  return;
}

Assistant:

static void InitClass(nodecontext* p,nodeclass* Class)
{
    const nodeclass* Parent = Class->ParentClass;
    if (Class->State==CLASS_REGISTERED && Class->Meta && (!Class->ParentId || (Parent && Parent->State>=CLASS_INITED)))
    {
        uintptr_t Data;
        const nodemeta* i;

        if (Parent)
        {
            fourcc_t ClassId;

            if (Class->VMTSize == DEFAULT_VMT && Parent->VMTSize > DEFAULT_VMT)
            {
                Class = NodeClassResize(p,Class,Parent->VMTSize);
                if (!Class)
                    return;
            }

            assert(Parent->VMTSize >= DEFAULT_VMT);
            assert(Class->VMTSize >= Parent->VMTSize);
            assert(NodeClass_Context(Parent) == NodeClass_Context(Class));

            ClassId = NodeClass_ClassId(Class);
            memcpy(Class+1,Parent+1,MIN(Class->VMTSize,Parent->VMTSize));
            NodeClass_ClassId(Class) = ClassId;
        }

        BuildMetaLookup(p,Class);

        assert(Class->VMTSize >= DEFAULT_VMT);
        Class->State = CLASS_INITED;

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_VMT)
            {
#if defined(CONFIG_CORECDOC)
                if ((i->Meta & ~META_MODE_MASK)==TYPE_FUNC) // otherwise it might be some doc items
#endif
                    MetaConst(i,Class+1);
            }
            else
            switch (i->Meta)
            {
            case META_CLASS_VMT_CREATE:
                if (((int(*)(fourcc_t,void*))i->Data)(NodeClass_ClassId(Class),Class+1) != ERR_NONE)
                {
                    ReleaseMetaLookup(p,Class);
                    p->NodeCache = NULL;
                    Class->State = CLASS_FAILED;
                }
                break;

            case META_CLASS_META:
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_FLAGS,&Data))
                    Class->Flags = (uint8_t)Data;
                if (((bool_t(*)(nodecontext*,void*,datameta,uintptr_t*))i->Data)(p,Class+1,META_CLASS_PRIORITY,&Data))
                    Class->Priority = (int16_t)(Data-PRI_DEFAULT);
                break;

            case META_CLASS_FLAGS:
                Class->Flags = (uint8_t)i->Data;
                break;

            case META_CLASS_PRIORITY:
                Class->Priority = (int16_t)(i->Data-PRI_DEFAULT);
                break;
            }
        }

        if (Class->State>=CLASS_INITED && (Class->Flags & (CFLAG_SINGLETON|CFLAG_OWN_MEMORY))==CFLAG_SINGLETON && !NodeCreateFromClass(p,Class,1))
        {
            p->NodeCache = NULL;
            Class->State = CLASS_FAILED;
            UnInitClass(p,Class,0); // just to call META_CLASS_VMT_DELETE
        }

        if (Class->State>=CLASS_INITED)
        {
            nodeclass** nc;
            for (nc=ARRAYBEGIN(p->NodeClass,nodeclass*);nc!=ARRAYEND(p->NodeClass,nodeclass*);++nc)
                if ((*nc)->ParentClass == Class)
                    InitClass(p,*nc);
        }
    }
}